

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_ScoringTableTest_NonDealerSelfDrawn_TestShell::createTest
          (TEST_ScoringTableTest_NonDealerSelfDrawn_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                                  ,0x57);
  this_00->_vptr_Utest = (_func_int **)0x0;
  *(undefined1 *)&this_00[1]._vptr_Utest = 0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_001dd558;
  return this_00;
}

Assistant:

TEST(ScoringTableTest, NonDealerSelfDrawn)
{
	CHECK_EQUAL(300, t.nonDealerSelfDrawn(1, 30).first);
	CHECK_EQUAL(500, t.nonDealerSelfDrawn(1, 30).second);
	CHECK_EQUAL(400, t.nonDealerSelfDrawn(1, 40).first);
	CHECK_EQUAL(700, t.nonDealerSelfDrawn(1, 40).second);
	CHECK_EQUAL(400, t.nonDealerSelfDrawn(1, 50).first);
	CHECK_EQUAL(800, t.nonDealerSelfDrawn(1, 50).second);
	CHECK_EQUAL(500, t.nonDealerSelfDrawn(1, 60).first);
	CHECK_EQUAL(1000, t.nonDealerSelfDrawn(1, 60).second);
	CHECK_EQUAL(600, t.nonDealerSelfDrawn(1, 70).first);
	CHECK_EQUAL(1200, t.nonDealerSelfDrawn(1, 70).second);

	CHECK_EQUAL(400, t.nonDealerSelfDrawn(2, 20).first);
	CHECK_EQUAL(700, t.nonDealerSelfDrawn(2, 20).second);
	CHECK_EQUAL(500, t.nonDealerSelfDrawn(2, 30).first);
	CHECK_EQUAL(1000, t.nonDealerSelfDrawn(2, 30).second);
	CHECK_EQUAL(700, t.nonDealerSelfDrawn(2, 40).first);
	CHECK_EQUAL(1300, t.nonDealerSelfDrawn(2, 40).second);
	CHECK_EQUAL(800, t.nonDealerSelfDrawn(2, 50).first);
	CHECK_EQUAL(1600, t.nonDealerSelfDrawn(2, 50).second);
	CHECK_EQUAL(1000, t.nonDealerSelfDrawn(2, 60).first);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(2, 60).second);
	CHECK_EQUAL(1200, t.nonDealerSelfDrawn(2, 70).first);
	CHECK_EQUAL(2300, t.nonDealerSelfDrawn(2, 70).second);

	CHECK_EQUAL(700, t.nonDealerSelfDrawn(3, 20).first);
	CHECK_EQUAL(1300, t.nonDealerSelfDrawn(3, 20).second);
	CHECK_EQUAL(1000, t.nonDealerSelfDrawn(3, 30).first);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(3, 30).second);
	CHECK_EQUAL(1300, t.nonDealerSelfDrawn(3, 40).first);
	CHECK_EQUAL(2600, t.nonDealerSelfDrawn(3, 40).second);
	CHECK_EQUAL(1600, t.nonDealerSelfDrawn(3, 50).first);
	CHECK_EQUAL(3200, t.nonDealerSelfDrawn(3, 50).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(3, 60).first);
	CHECK_EQUAL(3900, t.nonDealerSelfDrawn(3, 60).second);

	CHECK_EQUAL(1300, t.nonDealerSelfDrawn(4, 20).first);
	CHECK_EQUAL(2600, t.nonDealerSelfDrawn(4, 20).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(4, 30).first);
	CHECK_EQUAL(3900, t.nonDealerSelfDrawn(4, 30).second);
}